

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O1

void __thiscall
Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::~Impl2T(Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
          *this)

{
  double *pdVar1;
  elem_ptr_pointer pvVar2;
  elem_ptr_pointer pvVar3;
  void_pointer pvVar4;
  void_pointer pvVar5;
  elem_ptr_pointer pvVar6;
  
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_002bfc48;
  Cookie::~Cookie(&this->cookie);
  pdVar1 = (this->p)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (pdVar1 != (double *)0x0) {
    operator_delete__(pdVar1);
  }
  (this->p)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  pvVar3 = (this->v)._free_elem;
  pvVar2 = (elem_ptr_pointer)(this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage
  ;
  for (pvVar6 = pvVar2; pvVar3 != pvVar6; pvVar6 = pvVar6 + 1) {
    (*((pvVar6->ptr).second)->_vptr_Interface[3])();
    (pvVar6->ptr).second = (Interface *)0x0;
    (pvVar6->sf).first = 0;
    (pvVar6->
    super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
    ).
    super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
    .cf = (clone_func_ptr_t)0x0;
    (pvVar6->ptr).first = (void *)0x0;
    (pvVar6->sf).second = 0;
  }
  (this->v)._free_elem = pvVar2;
  (this->v)._align_max = 8;
  pvVar4 = (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage;
  pvVar5 = pvVar4;
  if (((ulong)((long)(this->v)._begin_storage - (long)pvVar4) / 5 & 0xfffffffffffffff8) * 5 != 0) {
    do {
      *(undefined8 *)((long)pvVar4 + 0x18) = 0;
      *(undefined8 *)((long)pvVar4 + 0x20) = 0;
      *(undefined8 *)((long)pvVar4 + 8) = 0;
      *(undefined8 *)((long)pvVar4 + 0x10) = 0;
      pvVar4 = (void_pointer)((long)pvVar4 + 0x28);
      pvVar5 = (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage;
    } while (pvVar4 != (void_pointer)
                       ((long)pvVar5 +
                       ((ulong)((long)(this->v)._begin_storage - (long)pvVar5) / 0x28) * 0x28));
  }
  (this->v)._free_elem = (elem_ptr_pointer)0x0;
  (this->v)._begin_storage = (void_pointer)0x0;
  operator_delete(pvVar5,(long)(this->v).super_allocator_base<std::allocator<unsigned_char>_>.
                               _end_storage - (long)pvVar5);
  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage = (void_pointer)0x0;
  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._end_storage = (void_pointer)0x0;
  operator_delete((void *)0x0,
                  (ulong)(this->v).super_allocator_base<std::allocator<unsigned_char>_>._end_storage
                 );
  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage = (void_pointer)0x0;
  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._end_storage = (void_pointer)0x0;
  operator_delete(this,0x100,0x40);
  return;
}

Assistant:

explicit Impl2T(bool throw_on_copy = false)
        : Interface { throw_on_copy }
        , p { new double[137] }
    {
        cookie.set();
    }